

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdOutput.h
# Opt level: O1

void __thiscall TCLAP::StdOutput::_longUsage(StdOutput *this,CmdLineInterface *_cmd,ostream *os)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  Arg *pAVar3;
  pointer ppAVar4;
  _List_node_base *p_Var5;
  char cVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long *plVar8;
  ulong uVar9;
  _List_node_base *p_Var10;
  ulong uVar11;
  pointer ppAVar12;
  bool bVar13;
  bool bVar14;
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  xorList;
  list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> argList;
  XorHandler xorHandler;
  string message;
  undefined1 *local_d8 [2];
  undefined1 local_c8 [16];
  string local_b8;
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  local_98;
  list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> local_80;
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  local_68;
  string local_50;
  
  iVar7 = (*_cmd->_vptr_CmdLineInterface[0xb])(_cmd);
  std::__cxx11::list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::list
            (&local_80,
             (list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *)CONCAT44(extraout_var,iVar7));
  iVar7 = (*_cmd->_vptr_CmdLineInterface[0xe])(_cmd);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  lVar2 = *(long *)CONCAT44(extraout_var_00,iVar7);
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,lVar2,((long *)CONCAT44(extraout_var_00,iVar7))[1] + lVar2);
  iVar7 = (*_cmd->_vptr_CmdLineInterface[0xc])(_cmd);
  std::
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  ::vector(&local_68,
           (vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
            *)CONCAT44(extraout_var_01,iVar7));
  std::
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  ::vector(&local_98,&local_68);
  cVar6 = (char)os;
  if (local_98.
      super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_98.
      super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    paVar1 = &local_b8.field_2;
    uVar11 = 0;
    do {
      ppAVar12 = local_98.
                 super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar11].
                 super__Vector_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      if (ppAVar12 !=
          local_98.
          super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar11].
          super__Vector_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        do {
          pAVar3 = *ppAVar12;
          local_d8[0] = local_c8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"val","");
          (*pAVar3->_vptr_Arg[9])(&local_b8,pAVar3,(string *)local_d8);
          spacePrint(this,os,&local_b8,0x4b,3,3);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != paVar1) {
            operator_delete(local_b8._M_dataplus._M_p);
          }
          if (local_d8[0] != local_c8) {
            operator_delete(local_d8[0]);
          }
          Arg::getDescription_abi_cxx11_(&local_b8,*ppAVar12);
          spacePrint(this,os,&local_b8,0x4b,5,0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != paVar1) {
            operator_delete(local_b8._M_dataplus._M_p);
          }
          ppAVar12 = ppAVar12 + 1;
          if (ppAVar12 !=
              local_98.
              super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar11].
              super__Vector_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            local_b8._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"-- OR --","");
            spacePrint(this,os,&local_b8,0x4b,9,0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p != paVar1) {
              operator_delete(local_b8._M_dataplus._M_p);
            }
          }
        } while (ppAVar12 !=
                 local_98.
                 super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar11].
                 super__Vector_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar6);
      std::ostream::put(cVar6);
      plVar8 = (long *)std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
      std::ostream::put((char)plVar8);
      std::ostream::flush();
      uVar11 = uVar11 + 1;
      uVar9 = ((long)local_98.
                     super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_98.
                     super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    } while (uVar11 <= uVar9 && uVar9 - uVar11 != 0);
  }
  if (local_80.super__List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl._M_node.
      super__List_node_base._M_next != (_List_node_base *)&local_80) {
    p_Var10 = local_80.super__List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl._M_node
              .super__List_node_base._M_next;
    do {
      bVar13 = (long)local_68.
                     super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_68.
                     super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start != 0;
      if (bVar13) {
        uVar11 = ((long)local_68.
                        super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_68.
                        super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
        bVar13 = true;
        uVar9 = 0;
        do {
          ppAVar12 = local_68.
                     super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar9].
                     super__Vector_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
          ppAVar4 = local_68.
                    super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar9].
                    super__Vector_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          bVar14 = ppAVar12 == ppAVar4;
          if (!bVar14) {
            pAVar3 = *ppAVar12;
            while (pAVar3 != (Arg *)p_Var10[1]._M_next) {
              ppAVar12 = ppAVar12 + 1;
              bVar14 = ppAVar12 == ppAVar4;
              if (bVar14) goto LAB_0011e602;
              pAVar3 = *ppAVar12;
            }
            if (!bVar14) break;
          }
LAB_0011e602:
          uVar9 = uVar9 + 1;
          bVar13 = uVar9 <= uVar11 && uVar11 - uVar9 != 0;
        } while (uVar9 != uVar11 + (uVar11 == 0));
      }
      if (!bVar13) {
        p_Var5 = p_Var10[1]._M_next;
        local_d8[0] = local_c8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"val","");
        (*(code *)p_Var5->_M_next[4]._M_prev)(&local_b8,p_Var5,(string *)local_d8);
        spacePrint(this,os,&local_b8,0x4b,3,3);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p);
        }
        if (local_d8[0] != local_c8) {
          operator_delete(local_d8[0]);
        }
        Arg::getDescription_abi_cxx11_(&local_b8,(Arg *)p_Var10[1]._M_next);
        spacePrint(this,os,&local_b8,0x4b,5,0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p);
        }
        std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar6);
        std::ostream::put(cVar6);
        std::ostream::flush();
      }
      p_Var10 = p_Var10->_M_next;
    } while (p_Var10 != (_List_node_base *)&local_80);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar6);
  std::ostream::put(cVar6);
  std::ostream::flush();
  spacePrint(this,os,&local_50,0x4b,3,0);
  std::
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  ::~vector(&local_98);
  std::
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  ::~vector(&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  while (local_80.super__List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl._M_node.
         super__List_node_base._M_next != (_List_node_base *)&local_80) {
    p_Var10 = (((_List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *)
               &(local_80.super__List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl.
                 _M_node.super__List_node_base._M_next)->_M_next)->_M_impl)._M_node.
              super__List_node_base._M_next;
    operator_delete(local_80.super__List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl.
                    _M_node.super__List_node_base._M_next);
    local_80.super__List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl._M_node.
    super__List_node_base._M_next = p_Var10;
  }
  return;
}

Assistant:

inline void 
StdOutput::_longUsage( CmdLineInterface& _cmd, 
					   std::ostream& os ) const
{
	std::list<Arg*> argList = _cmd.getArgList();
	std::string message = _cmd.getMessage();
	XorHandler xorHandler = _cmd.getXorHandler();
	std::vector< std::vector<Arg*> > xorList = xorHandler.getXorList();

	// first the xor 
	for ( int i = 0; static_cast<unsigned int>(i) < xorList.size(); i++ )
		{
			for ( ArgVectorIterator it = xorList[i].begin(); 
				  it != xorList[i].end(); 
				  it++ )
				{
					spacePrint( os, (*it)->longID(), 75, 3, 3 );
					spacePrint( os, (*it)->getDescription(), 75, 5, 0 );

					if ( it+1 != xorList[i].end() )
						spacePrint(os, "-- OR --", 75, 9, 0);
				}
			os << std::endl << std::endl;
		}

	// then the rest
	for (ArgListIterator it = argList.begin(); it != argList.end(); it++)
		if ( !xorHandler.contains( (*it) ) )
			{
				spacePrint( os, (*it)->longID(), 75, 3, 3 ); 
				spacePrint( os, (*it)->getDescription(), 75, 5, 0 ); 
				os << std::endl;
			}

	os << std::endl;

	spacePrint( os, message, 75, 3, 0 );
}